

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O0

void Handler_gibhealth_I_Actor(AActor *defaults,PClassActor *info,Baggage *bag,FPropParam *params)

{
  int iVar1;
  bool bVar2;
  int id;
  FPropParam *params_local;
  Baggage *bag_local;
  PClassActor *info_local;
  AActor *defaults_local;
  
  iVar1 = params[1].i;
  bVar2 = DObject::IsKindOf((DObject *)info,PClassActor::RegistrationInfo.MyClass);
  if (!bVar2) {
    __assert_fail("info->IsKindOf(RUNTIME_CLASS(PClassActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_properties.cpp"
                  ,0x240,
                  "void Handler_gibhealth_I_Actor(AActor *, PClassActor *, Baggage &, FPropParam *)"
                 );
  }
  info->GibHealth = iVar1;
  return;
}

Assistant:

DEFINE_PROPERTY(gibhealth, I, Actor)
{
	PROP_INT_PARM(id, 0);
	assert(info->IsKindOf(RUNTIME_CLASS(PClassActor)));
	static_cast<PClassActor *>(info)->GibHealth = id;
}